

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::createEmptyTexture
          (anon_unknown_0 *this,deUint32 format,TextureType type,IVec3 *textureSize,int numLevels,
          int lodBase,Sampler *sampler)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Texture1D *pTVar4;
  Texture2D *pTVar5;
  Texture3D *pTVar6;
  TextureCube *pTVar7;
  Texture1DArray *pTVar8;
  Texture2DArray *pTVar9;
  TextureCubeArray *pTVar10;
  TextureBinding *pTVar11;
  SharedPtrStateBase *extraout_RDX;
  TextureBindingSp TVar12;
  SharedPtr<vkt::sr::TextureBinding> local_190;
  int local_180;
  DefaultDeleter<tcu::TextureCubeArray> local_179;
  int level_6;
  MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> texture_6;
  int local_158;
  DefaultDeleter<tcu::Texture2DArray> local_151;
  int level_5;
  MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> texture_5;
  int local_130;
  DefaultDeleter<tcu::Texture1DArray> local_129;
  int level_4;
  MovePtr<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> texture_4;
  CubeFace local_104;
  int local_100;
  int face;
  int level_3;
  MovePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> texture_3;
  int local_d8;
  DefaultDeleter<tcu::Texture3D> local_d1;
  int level_2;
  MovePtr<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> texture_2;
  int local_b0;
  DefaultDeleter<tcu::Texture2D> local_a9;
  int level_1;
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> texture_1;
  int local_84;
  DefaultDeleter<tcu::Texture1D> local_7d;
  int level;
  undefined1 local_70 [8];
  MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> texture;
  undefined1 local_4c [8];
  Parameters params;
  TextureFormat texFmt;
  int lodBase_local;
  int numLevels_local;
  IVec3 *textureSize_local;
  TextureType type_local;
  deUint32 format_local;
  TextureBindingSp *textureBinding;
  
  params._20_8_ = glu::mapGLInternalFormat(format);
  join_0x00000010_0x00000000_ = ::vk::makeComponentMappingRGBA();
  TextureBinding::Parameters::Parameters
            ((Parameters *)local_4c,lodBase,join_0x00000010_0x00000000_,VK_SAMPLE_COUNT_1_BIT,
             INIT_UPLOAD_DATA);
  texture.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data._11_1_ = 0;
  de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr((SharedPtr<vkt::sr::TextureBinding> *)this);
  switch(type) {
  case TEXTURETYPE_1D:
    pTVar4 = (Texture1D *)operator_new(0x50);
    iVar2 = tcu::Vector<int,_3>::x(textureSize);
    tcu::Texture1D::Texture1D(pTVar4,(TextureFormat *)&params.samples,iVar2);
    de::DefaultDeleter<tcu::Texture1D>::DefaultDeleter(&local_7d);
    de::details::MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::MovePtr
              ((MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)local_70,pTVar4);
    for (local_84 = 0; local_84 < numLevels; local_84 = local_84 + 1) {
      pTVar4 = de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::
               operator->((UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)
                          local_70);
      tcu::Texture1D::allocLevel(pTVar4,local_84);
    }
    pTVar11 = (TextureBinding *)operator_new(0x68);
    pTVar4 = de::details::MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::release
                       ((MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)local_70);
    TextureBinding::TextureBinding(pTVar11,pTVar4,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_1.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.
                m_data.field_0x8,pTVar11);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,
               (SharedPtr<vkt::sr::TextureBinding> *)
               &texture_1.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.
                m_data.field_0x8);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_1.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.
                m_data.field_0x8);
    de::details::MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::~MovePtr
              ((MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)local_70);
    break;
  case TEXTURETYPE_2D:
    pTVar5 = (Texture2D *)operator_new(0x50);
    iVar2 = tcu::Vector<int,_3>::x(textureSize);
    iVar3 = tcu::Vector<int,_3>::y(textureSize);
    tcu::Texture2D::Texture2D(pTVar5,(TextureFormat *)&params.samples,iVar2,iVar3);
    de::DefaultDeleter<tcu::Texture2D>::DefaultDeleter(&local_a9);
    de::details::MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::MovePtr
              ((MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&level_1,pTVar5);
    for (local_b0 = 0; local_b0 < numLevels; local_b0 = local_b0 + 1) {
      pTVar5 = de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::
               operator->((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)
                          &level_1);
      tcu::Texture2D::allocLevel(pTVar5,local_b0);
    }
    pTVar11 = (TextureBinding *)operator_new(0x68);
    pTVar5 = de::details::MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::release
                       ((MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&level_1);
    TextureBinding::TextureBinding(pTVar11,pTVar5,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_2.super_UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>.
                m_data.field_0x8,pTVar11);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,
               (SharedPtr<vkt::sr::TextureBinding> *)
               &texture_2.super_UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>.
                m_data.field_0x8);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_2.super_UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>.
                m_data.field_0x8);
    de::details::MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~MovePtr
              ((MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&level_1);
    break;
  case TEXTURETYPE_3D:
    pTVar6 = (Texture3D *)operator_new(0x58);
    iVar2 = tcu::Vector<int,_3>::x(textureSize);
    iVar3 = tcu::Vector<int,_3>::y(textureSize);
    iVar1 = tcu::Vector<int,_3>::z(textureSize);
    tcu::Texture3D::Texture3D(pTVar6,(TextureFormat *)&params.samples,iVar2,iVar3,iVar1);
    de::DefaultDeleter<tcu::Texture3D>::DefaultDeleter(&local_d1);
    de::details::MovePtr<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::MovePtr
              ((MovePtr<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&level_2,pTVar6);
    for (local_d8 = 0; local_d8 < numLevels; local_d8 = local_d8 + 1) {
      pTVar6 = de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::
               operator->((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)
                          &level_2);
      tcu::Texture3D::allocLevel(pTVar6,local_d8);
    }
    pTVar11 = (TextureBinding *)operator_new(0x68);
    pTVar6 = de::details::MovePtr<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::release
                       ((MovePtr<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&level_2);
    TextureBinding::TextureBinding(pTVar11,pTVar6,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_3.super_UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>.
                m_data.field_0x8,pTVar11);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,
               (SharedPtr<vkt::sr::TextureBinding> *)
               &texture_3.super_UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>.
                m_data.field_0x8);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_3.super_UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>.
                m_data.field_0x8);
    de::details::MovePtr<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::~MovePtr
              ((MovePtr<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&level_2);
    break;
  case TEXTURETYPE_CUBE_MAP:
    pTVar7 = (TextureCube *)operator_new(0x168);
    iVar2 = tcu::Vector<int,_3>::x(textureSize);
    tcu::TextureCube::TextureCube(pTVar7,(TextureFormat *)&params.samples,iVar2);
    de::DefaultDeleter<tcu::TextureCube>::DefaultDeleter
              ((DefaultDeleter<tcu::TextureCube> *)((long)&face + 3));
    de::details::MovePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::MovePtr
              ((MovePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&level_3,pTVar7);
    for (local_100 = 0; local_100 < numLevels; local_100 = local_100 + 1) {
      for (local_104 = CUBEFACE_NEGATIVE_X; (int)local_104 < 6;
          local_104 = local_104 + CUBEFACE_POSITIVE_X) {
        pTVar7 = de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::
                 operator->((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)
                            &level_3);
        tcu::TextureCube::allocLevel(pTVar7,local_104,local_100);
      }
    }
    pTVar11 = (TextureBinding *)operator_new(0x68);
    pTVar7 = de::details::MovePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::release
                       ((MovePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&level_3
                       );
    TextureBinding::TextureBinding(pTVar11,pTVar7,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_4.
                super_UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>.
                m_data.field_0x8,pTVar11);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,
               (SharedPtr<vkt::sr::TextureBinding> *)
               &texture_4.
                super_UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>.
                m_data.field_0x8);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_4.
                super_UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>.
                m_data.field_0x8);
    de::details::MovePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::~MovePtr
              ((MovePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&level_3);
    break;
  case TEXTURETYPE_1D_ARRAY:
    pTVar8 = (Texture1DArray *)operator_new(0x50);
    iVar2 = tcu::Vector<int,_3>::x(textureSize);
    iVar3 = tcu::Vector<int,_3>::z(textureSize);
    tcu::Texture1DArray::Texture1DArray(pTVar8,(TextureFormat *)&params.samples,iVar2,iVar3);
    de::DefaultDeleter<tcu::Texture1DArray>::DefaultDeleter(&local_129);
    de::details::MovePtr<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::MovePtr
              ((MovePtr<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)&level_4,
               pTVar8);
    for (local_130 = 0; local_130 < numLevels; local_130 = local_130 + 1) {
      pTVar8 = de::details::
               UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::operator->
                         ((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>
                           *)&level_4);
      tcu::Texture1DArray::allocLevel(pTVar8,local_130);
    }
    pTVar11 = (TextureBinding *)operator_new(0x68);
    pTVar8 = de::details::MovePtr<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::
             release((MovePtr<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)
                     &level_4);
    TextureBinding::TextureBinding(pTVar11,pTVar8,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_5.
                super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
                m_data.field_0x8,pTVar11);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,
               (SharedPtr<vkt::sr::TextureBinding> *)
               &texture_5.
                super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
                m_data.field_0x8);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_5.
                super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
                m_data.field_0x8);
    de::details::MovePtr<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::~MovePtr
              ((MovePtr<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)&level_4);
    break;
  case TEXTURETYPE_2D_ARRAY:
    pTVar9 = (Texture2DArray *)operator_new(0x58);
    iVar2 = tcu::Vector<int,_3>::x(textureSize);
    iVar3 = tcu::Vector<int,_3>::y(textureSize);
    iVar1 = tcu::Vector<int,_3>::z(textureSize);
    tcu::Texture2DArray::Texture2DArray(pTVar9,(TextureFormat *)&params.samples,iVar2,iVar3,iVar1);
    de::DefaultDeleter<tcu::Texture2DArray>::DefaultDeleter(&local_151);
    de::details::MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::MovePtr
              ((MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)&level_5,
               pTVar9);
    for (local_158 = 0; local_158 < numLevels; local_158 = local_158 + 1) {
      pTVar9 = de::details::
               UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::operator->
                         ((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>
                           *)&level_5);
      tcu::Texture2DArray::allocLevel(pTVar9,local_158);
    }
    pTVar11 = (TextureBinding *)operator_new(0x68);
    pTVar9 = de::details::MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
             release((MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                     &level_5);
    TextureBinding::TextureBinding(pTVar11,pTVar9,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_6.
                super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
                m_data.field_0x8,pTVar11);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,
               (SharedPtr<vkt::sr::TextureBinding> *)
               &texture_6.
                super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
                m_data.field_0x8);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)
               &texture_6.
                super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
                m_data.field_0x8);
    de::details::MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::~MovePtr
              ((MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)&level_5);
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    pTVar10 = (TextureCubeArray *)operator_new(0x50);
    iVar2 = tcu::Vector<int,_3>::x(textureSize);
    iVar3 = tcu::Vector<int,_3>::z(textureSize);
    tcu::TextureCubeArray::TextureCubeArray(pTVar10,(TextureFormat *)&params.samples,iVar2,iVar3);
    de::DefaultDeleter<tcu::TextureCubeArray>::DefaultDeleter(&local_179);
    de::details::MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::MovePtr
              ((MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)
               &level_6,pTVar10);
    for (local_180 = 0; local_180 < numLevels; local_180 = local_180 + 1) {
      pTVar10 = de::details::
                UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
                operator->((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
                            *)&level_6);
      tcu::TextureCubeArray::allocLevel(pTVar10,local_180);
    }
    pTVar11 = (TextureBinding *)operator_new(0x68);
    pTVar10 = de::details::
              MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::release
                        ((MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
                          *)&level_6);
    TextureBinding::TextureBinding(pTVar11,pTVar10,sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr(&local_190,pTVar11);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              ((SharedPtr<vkt::sr::TextureBinding> *)this,&local_190);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&local_190);
    de::details::MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
    ~MovePtr((MovePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)&level_6)
    ;
  }
  pTVar11 = de::SharedPtr<vkt::sr::TextureBinding>::operator->
                      ((SharedPtr<vkt::sr::TextureBinding> *)this);
  TextureBinding::setParameters(pTVar11,(Parameters *)local_4c);
  TVar12.m_state = extraout_RDX;
  TVar12.m_ptr = (TextureBinding *)this;
  return TVar12;
}

Assistant:

static TextureBindingSp createEmptyTexture (deUint32				format,
											TextureType				type,
											const tcu::IVec3&		textureSize,
											int						numLevels,
											int						lodBase,
											const tcu::Sampler&		sampler)
{
	const tcu::TextureFormat			texFmt				= glu::mapGLInternalFormat(format);
	const TextureBinding::Parameters	params				(lodBase);
	TextureBindingSp					textureBinding;

	switch (type)
	{

		case TEXTURETYPE_1D:
		{
			de::MovePtr<tcu::Texture1D>			texture		(new tcu::Texture1D(texFmt, textureSize.x()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_2D:
		{
			de::MovePtr<tcu::Texture2D>			texture		(new tcu::Texture2D(texFmt, textureSize.x(), textureSize.y()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_3D:
		{
			de::MovePtr<tcu::Texture3D>			texture		(new tcu::Texture3D(texFmt, textureSize.x(), textureSize.y(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			de::MovePtr<tcu::TextureCube>		texture		(new tcu::TextureCube(texFmt, textureSize.x()));

			for (int level = 0; level < numLevels; level++)
				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
					texture->allocLevel((tcu::CubeFace)face, level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_1D_ARRAY:
		{
			de::MovePtr<tcu::Texture1DArray>	texture		(new tcu::Texture1DArray(texFmt, textureSize.x(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_2D_ARRAY:
		{
			de::MovePtr<tcu::Texture2DArray>	texture		(new tcu::Texture2DArray(texFmt, textureSize.x(), textureSize.y(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		case TEXTURETYPE_CUBE_ARRAY:
		{
			de::MovePtr<tcu::TextureCubeArray>	texture		(new tcu::TextureCubeArray(texFmt, textureSize.x(), textureSize.z()));

			for (int level = 0; level < numLevels; level++)
				texture->allocLevel(level);

			textureBinding = TextureBindingSp(new TextureBinding(texture.release(), sampler));
			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	textureBinding->setParameters(params);
	return textureBinding;
}